

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O2

int readImmediate(InternalInstruction *insn,uint8_t size)

{
  byte bVar1;
  int iVar2;
  ulong in_RAX;
  uint uVar3;
  uint64_t uVar4;
  long lVar5;
  uint8_t imm8;
  ulong uStack_38;
  
  bVar1 = insn->numImmediatesConsumed;
  if (bVar1 == 2) {
    return -1;
  }
  if (size == '\0') {
    size = insn->immediateSize;
  }
  else {
    insn->immediateSize = size;
  }
  insn->immediateOffset = (char)(int)insn->readerCursor - (char)(int)insn->startLocation;
  uStack_38 = in_RAX;
  switch(size) {
  case '\x01':
    iVar2 = consumeByte(insn,&imm8);
    if (iVar2 != 0) {
      return -1;
    }
    uVar4 = uStack_38 >> 0x20 & 0xff;
    break;
  case '\x02':
    bVar1 = 0;
    uVar3 = 0;
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      iVar2 = (*insn->reader)((reader_info *)insn->readerArg,
                              (uint8_t *)((long)register0x00000020 + -0x33),
                              insn->readerCursor + lVar5);
      if (iVar2 != 0) {
        return -1;
      }
      uVar3 = uVar3 | (uint)uStack_38._5_1_ << (bVar1 & 0x3f);
      bVar1 = bVar1 + 8;
    }
    insn->readerCursor = insn->readerCursor + 2;
    uVar4 = (uint64_t)(uVar3 & 0xffff);
    break;
  default:
    goto switchD_001a0226_caseD_3;
  case '\x04':
    bVar1 = 0;
    uVar3 = 0;
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      iVar2 = (*insn->reader)((reader_info *)insn->readerArg,
                              (uint8_t *)((long)register0x00000020 + -0x32),
                              insn->readerCursor + lVar5);
      if (iVar2 != 0) {
        return -1;
      }
      uVar3 = uVar3 | (uint)uStack_38._6_1_ << (bVar1 & 0x3f);
      bVar1 = bVar1 + 8;
    }
    insn->readerCursor = insn->readerCursor + 4;
    uVar4 = (uint64_t)uVar3;
    break;
  case '\b':
    bVar1 = 0;
    uVar4 = 0;
    for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
      iVar2 = (*insn->reader)((reader_info *)insn->readerArg,
                              (uint8_t *)((long)register0x00000020 + -0x31),
                              insn->readerCursor + lVar5);
      if (iVar2 != 0) {
        return -1;
      }
      uVar4 = uVar4 | (uStack_38 >> 0x38) << (bVar1 & 0x3f);
      bVar1 = bVar1 + 8;
    }
    insn->readerCursor = insn->readerCursor + 8;
  }
  bVar1 = insn->numImmediatesConsumed;
  insn->immediates[bVar1] = uVar4;
switchD_001a0226_caseD_3:
  insn->numImmediatesConsumed = bVar1 + 1;
  return 0;
}

Assistant:

static int readImmediate(struct InternalInstruction *insn, uint8_t size)
{
	uint8_t imm8;
	uint16_t imm16;
	uint32_t imm32;
	uint64_t imm64;

	// dbgprintf(insn, "readImmediate()");

	if (insn->numImmediatesConsumed == 2) {
		//debug("Already consumed two immediates");
		return -1;
	}

	if (size == 0)
		size = insn->immediateSize;
	else
		insn->immediateSize = size;
	insn->immediateOffset = (uint8_t)(insn->readerCursor - insn->startLocation);

	switch (size) {
		case 1:
			if (consumeByte(insn, &imm8))
				return -1;
			insn->immediates[insn->numImmediatesConsumed] = imm8;
			break;
		case 2:
			if (consumeUInt16(insn, &imm16))
				return -1;
			insn->immediates[insn->numImmediatesConsumed] = imm16;
			break;
		case 4:
			if (consumeUInt32(insn, &imm32))
				return -1;
			insn->immediates[insn->numImmediatesConsumed] = imm32;
			break;
		case 8:
			if (consumeUInt64(insn, &imm64))
				return -1;
			insn->immediates[insn->numImmediatesConsumed] = imm64;
			break;
	}

	insn->numImmediatesConsumed++;

	return 0;
}